

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::CheckBinding
          (ShaderImageLoadStoreBase *this,GLuint unit,GLuint texture,GLint level,GLboolean layered,
          GLint layer,GLenum access,GLenum format)

{
  byte local_31;
  uint local_30;
  uint uStack_2c;
  GLboolean b;
  GLint i;
  GLint layer_local;
  GLuint GStack_20;
  GLboolean layered_local;
  GLint level_local;
  GLuint texture_local;
  GLuint unit_local;
  ShaderImageLoadStoreBase *this_local;
  
  uStack_2c = layer;
  i._3_1_ = layered;
  layer_local = level;
  GStack_20 = texture;
  level_local = unit;
  _texture_local = this;
  glu::CallLogWrapper::glGetIntegeri_v
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x8f3a,unit,
             (GLint *)&local_30);
  if (local_30 == GStack_20) {
    glu::CallLogWrapper::glGetBooleani_v
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x8f3a,level_local,
               &local_31);
    if ((bool)local_31 == (local_30 != 0)) {
      glu::CallLogWrapper::glGetIntegeri_v
                (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x8f3b,level_local,
                 (GLint *)&local_30);
      if (local_30 == layer_local) {
        glu::CallLogWrapper::glGetBooleani_v
                  (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x8f3b,
                   level_local,&local_31);
        if ((bool)local_31 == (local_30 != 0)) {
          glu::CallLogWrapper::glGetIntegeri_v
                    (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x8f3c,
                     level_local,(GLint *)&local_30);
          if (local_30 == i._3_1_) {
            glu::CallLogWrapper::glGetBooleani_v
                      (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x8f3c,
                       level_local,&local_31);
            if ((bool)local_31 == (local_30 != 0)) {
              glu::CallLogWrapper::glGetIntegeri_v
                        (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x8f3d,
                         level_local,(GLint *)&local_30);
              if (local_30 == uStack_2c) {
                glu::CallLogWrapper::glGetBooleani_v
                          (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x8f3d,
                           level_local,&local_31);
                if ((bool)local_31 == (local_30 != 0)) {
                  glu::CallLogWrapper::glGetIntegeri_v
                            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x8f3e,
                             level_local,(GLint *)&local_30);
                  if (local_30 == access) {
                    glu::CallLogWrapper::glGetBooleani_v
                              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,
                               0x8f3e,level_local,&local_31);
                    if ((bool)local_31 == (local_30 != 0)) {
                      glu::CallLogWrapper::glGetIntegeri_v
                                (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,
                                 0x906e,level_local,(GLint *)&local_30);
                      if (local_30 == format) {
                        glu::CallLogWrapper::glGetBooleani_v
                                  (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,
                                   0x906e,level_local,&local_31);
                        if ((bool)local_31 == (local_30 != 0)) {
                          this_local._7_1_ = true;
                        }
                        else {
                          anon_unknown_0::Output
                                    ("GL_IMAGE_BINDING_FORMAT (as boolean) is %d should be %d.\n",
                                     (ulong)local_31,(ulong)(local_30 != 0));
                          this_local._7_1_ = false;
                        }
                      }
                      else {
                        anon_unknown_0::Output
                                  ("GL_IMAGE_BINDING_FORMAT is %d should be %d.\n",(ulong)local_30,
                                   (ulong)format);
                        this_local._7_1_ = false;
                      }
                    }
                    else {
                      anon_unknown_0::Output
                                ("GL_IMAGE_BINDING_ACCESS (as boolean) is %d should be %d.\n",
                                 (ulong)local_31,(ulong)(local_30 != 0));
                      this_local._7_1_ = false;
                    }
                  }
                  else {
                    anon_unknown_0::Output
                              ("GL_IMAGE_BINDING_ACCESS is %d should be %d.\n",(ulong)local_30,
                               (ulong)access);
                    this_local._7_1_ = false;
                  }
                }
                else {
                  anon_unknown_0::Output
                            ("GL_IMAGE_BINDING_LAYER (as boolean) is %d should be %d.\n",
                             (ulong)local_31,(ulong)(local_30 != 0));
                  this_local._7_1_ = false;
                }
              }
              else {
                anon_unknown_0::Output
                          ("GL_IMAGE_BINDING_LAYER is %d should be %d.\n",(ulong)local_30,
                           (ulong)uStack_2c);
                this_local._7_1_ = false;
              }
            }
            else {
              anon_unknown_0::Output
                        ("GL_IMAGE_BINDING_LAYERED (as boolean) is %d should be %d.\n",
                         (ulong)local_31,(ulong)(local_30 != 0));
              this_local._7_1_ = false;
            }
          }
          else {
            anon_unknown_0::Output
                      ("GL_IMAGE_BINDING_LAYERED is %d should be %d.\n",(ulong)local_30,
                       (ulong)i._3_1_);
            this_local._7_1_ = false;
          }
        }
        else {
          anon_unknown_0::Output
                    ("GL_IMAGE_BINDING_LEVEL (as boolean) is %d should be %d.\n",(ulong)local_31,
                     (ulong)(local_30 != 0));
          this_local._7_1_ = false;
        }
      }
      else {
        anon_unknown_0::Output
                  ("GL_IMAGE_BINDING_LEVEL is %d should be %d.\n",(ulong)local_30,
                   (ulong)(uint)layer_local);
        this_local._7_1_ = false;
      }
    }
    else {
      anon_unknown_0::Output
                ("GL_IMAGE_BINDING_NAME (as boolean) is %d should be %d.\n",(ulong)local_31,
                 (ulong)(local_30 != 0));
      this_local._7_1_ = false;
    }
  }
  else {
    anon_unknown_0::Output
              ("GL_IMAGE_BINDING_NAME is %d should be %d.\n",(ulong)local_30,(ulong)GStack_20);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CheckBinding(GLuint unit, GLuint texture, GLint level, GLboolean layered, GLint layer, GLenum access,
					  GLenum format)
	{
		GLint	 i;
		GLboolean b;

		glGetIntegeri_v(GL_IMAGE_BINDING_NAME, unit, &i);
		if (static_cast<GLuint>(i) != texture)
		{
			Output("GL_IMAGE_BINDING_NAME is %d should be %d.\n", i, texture);
			return false;
		}
		glGetBooleani_v(GL_IMAGE_BINDING_NAME, unit, &b);
		if (b != (i ? GL_TRUE : GL_FALSE))
		{
			Output("GL_IMAGE_BINDING_NAME (as boolean) is %d should be %d.\n", b, (i ? GL_TRUE : GL_FALSE));
			return false;
		}

		glGetIntegeri_v(GL_IMAGE_BINDING_LEVEL, unit, &i);
		if (i != level)
		{
			Output("GL_IMAGE_BINDING_LEVEL is %d should be %d.\n", i, level);
			return false;
		}
		glGetBooleani_v(GL_IMAGE_BINDING_LEVEL, unit, &b);
		if (b != (i ? GL_TRUE : GL_FALSE))
		{
			Output("GL_IMAGE_BINDING_LEVEL (as boolean) is %d should be %d.\n", b, (i ? GL_TRUE : GL_FALSE));
			return false;
		}

		glGetIntegeri_v(GL_IMAGE_BINDING_LAYERED, unit, &i);
		if (i != layered)
		{
			Output("GL_IMAGE_BINDING_LAYERED is %d should be %d.\n", i, layered);
			return false;
		}
		glGetBooleani_v(GL_IMAGE_BINDING_LAYERED, unit, &b);
		if (b != (i ? GL_TRUE : GL_FALSE))
		{
			Output("GL_IMAGE_BINDING_LAYERED (as boolean) is %d should be %d.\n", b, (i ? GL_TRUE : GL_FALSE));
			return false;
		}

		glGetIntegeri_v(GL_IMAGE_BINDING_LAYER, unit, &i);
		if (i != layer)
		{
			Output("GL_IMAGE_BINDING_LAYER is %d should be %d.\n", i, layer);
			return false;
		}
		glGetBooleani_v(GL_IMAGE_BINDING_LAYER, unit, &b);
		if (b != (i ? GL_TRUE : GL_FALSE))
		{
			Output("GL_IMAGE_BINDING_LAYER (as boolean) is %d should be %d.\n", b, (i ? GL_TRUE : GL_FALSE));
			return false;
		}

		glGetIntegeri_v(GL_IMAGE_BINDING_ACCESS, unit, &i);
		if (static_cast<GLenum>(i) != access)
		{
			Output("GL_IMAGE_BINDING_ACCESS is %d should be %d.\n", i, access);
			return false;
		}
		glGetBooleani_v(GL_IMAGE_BINDING_ACCESS, unit, &b);
		if (b != (i ? GL_TRUE : GL_FALSE))
		{
			Output("GL_IMAGE_BINDING_ACCESS (as boolean) is %d should be %d.\n", b, (i ? GL_TRUE : GL_FALSE));
			return false;
		}

		glGetIntegeri_v(GL_IMAGE_BINDING_FORMAT, unit, &i);
		if (static_cast<GLenum>(i) != format)
		{
			Output("GL_IMAGE_BINDING_FORMAT is %d should be %d.\n", i, format);
			return false;
		}
		glGetBooleani_v(GL_IMAGE_BINDING_FORMAT, unit, &b);
		if (b != (i ? GL_TRUE : GL_FALSE))
		{
			Output("GL_IMAGE_BINDING_FORMAT (as boolean) is %d should be %d.\n", b, (i ? GL_TRUE : GL_FALSE));
			return false;
		}

		return true;
	}